

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::cpp_function>
          (pybind11 *this,cpp_function *args_)

{
  PyObject *pPVar1;
  handle hVar2;
  cast_error *__return_storage_ptr__;
  undefined1 local_68 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  argtypes;
  handle local_28;
  array<pybind11::object,_1UL> args;
  
  pPVar1 = (args_->super_function).super_object.super_handle.m_ptr;
  if (pPVar1 == (PyObject *)0x0) {
    local_28.m_ptr = (PyObject *)0x0;
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    local_28.m_ptr = (args_->super_function).super_object.super_handle.m_ptr;
    if (local_28.m_ptr != (PyObject *)0x0) {
      tuple::tuple<unsigned_long,_0>((tuple *)this,1);
      hVar2.m_ptr = local_28.m_ptr;
      local_28.m_ptr = (PyObject *)0x0;
      if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) != 0) {
        *(PyObject **)(*(long *)this + 0x18) = hVar2.m_ptr;
        object::~object((object *)&local_28);
        return (object)(object)this;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                    ,0x40b,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::cpp_function>]"
                   );
    }
  }
  type_id<pybind11::cpp_function>();
  __return_storage_ptr__ = (cast_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string((string *)((long)&argtypes._M_elems[0].field_2 + 8),0);
  cast_error_unable_to_convert_call_arg
            (__return_storage_ptr__,(string *)((long)&argtypes._M_elems[0].field_2 + 8),
             (string *)local_68);
  __cxa_throw(__return_storage_ptr__,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error_unable_to_convert_call_arg();
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}